

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.cpp
# Opt level: O0

_anonymous_namespace_ * __thiscall
Game::(anonymous_namespace)::drawEndGameLoopGraphics_abi_cxx11_
          (_anonymous_namespace_ *this,current_game_session_t *finalgamestatus)

{
  __tuple_element_t<1UL,_tuple<unsigned_long_long,_bool,_array<bool,_8UL>,_GameBoard>_> _Var1;
  _anonymous_namespace_ *this_00;
  gamestatus_t world_gamestatus;
  __tuple_element_t<0UL,_tuple<unsigned_long_long,_bool,_array<bool,_8UL>,_GameBoard>_> *p_Var2;
  __tuple_element_t<1UL,_tuple<unsigned_long_long,_bool,_array<bool,_8UL>,_GameBoard>_> *p_Var3;
  __tuple_element_t<3UL,_tuple<unsigned_long_long,_bool,_array<bool,_8UL>,_GameBoard>_> *p_Var4;
  __tuple_element_t<2UL,_tuple<unsigned_long_long,_bool,_array<bool,_8UL>,_GameBoard>_> *p_Var5;
  GameBoard *in_R8;
  undefined2 local_422;
  anon_class_16_2_1b05ec1b_conflict local_420;
  _Type local_410;
  undefined2 local_402;
  undefined1 local_400 [6];
  end_screen_display_data_t esdd;
  anon_class_72_2_1b079f8f local_3c0;
  tuple<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_378;
  anon_class_112_2_1b08a655 local_310;
  GameBoard local_2a0;
  undefined1 local_260 [8];
  scoreboard_display_data_t scdd;
  ostringstream local_1e8 [8];
  ostringstream str_os;
  __tuple_element_t<2UL,_tuple<unsigned_long_long,_bool,_array<bool,_8UL>,_GameBoard>_>
  end_gamestatus;
  __tuple_element_t<3UL,_tuple<unsigned_long_long,_bool,_array<bool,_8UL>,_GameBoard>_> gb;
  __tuple_element_t<1UL,_tuple<unsigned_long_long,_bool,_array<bool,_8UL>,_GameBoard>_> comp_mode;
  __tuple_element_t<0UL,_tuple<unsigned_long_long,_bool,_array<bool,_8UL>,_GameBoard>_> bestScore;
  current_game_session_t *finalgamestatus_local;
  
  p_Var2 = std::get<0ul,unsigned_long_long,bool,std::array<bool,8ul>,Game::GameBoard>
                     (finalgamestatus);
  this_00 = (_anonymous_namespace_ *)*p_Var2;
  p_Var3 = std::get<1ul,unsigned_long_long,bool,std::array<bool,8ul>,Game::GameBoard>
                     (finalgamestatus);
  _Var1 = *p_Var3;
  p_Var4 = std::get<3ul,unsigned_long_long,bool,std::array<bool,8ul>,Game::GameBoard>
                     (finalgamestatus);
  GameBoard::GameBoard((GameBoard *)&end_gamestatus,p_Var4);
  p_Var5 = std::get<2ul,unsigned_long_long,bool,std::array<bool,8ul>,Game::GameBoard>
                     (finalgamestatus);
  world_gamestatus._M_elems = *&p_Var5->_M_elems;
  std::__cxx11::ostringstream::ostringstream(local_1e8);
  clearScreen();
  DrawAlways<std::__cxx11::string(*)()>((ostream *)local_1e8,Graphics::AsciiArt2048_abi_cxx11_);
  GameBoard::GameBoard(&local_2a0,(GameBoard *)&end_gamestatus);
  make_scoreboard_display_data_abi_cxx11_
            ((scoreboard_display_data_t *)local_260,this_00,(ulong)(_Var1 & 1),SUB81(&local_2a0,0),
             in_R8);
  GameBoard::~GameBoard(&local_2a0);
  std::
  tuple<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::tuple(&local_378,
          (tuple<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)local_260);
  DataSuppliment<std::tuple<bool,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::__cxx11::string(*)(std::tuple<bool,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>)>
            (&local_310,&local_378,Graphics::GameScoreBoardOverlay);
  DrawAlways<DataSuppliment<std::tuple<bool,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::__cxx11::string(*)(std::tuple<bool,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>)>(std::tuple<bool,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::__cxx11::string(*)(std::tuple<bool,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>))::_lambda()_1_>
            ((ostream *)local_1e8,&local_310);
  DataSuppliment<std::tuple<bool,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::__cxx11::string(*)(std::tuple<bool,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>)>(std::tuple<bool,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::__cxx11::string(*)(std::tuple<bool,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>))
  ::{lambda()#1}::~DataSuppliment((_lambda___1_ *)&local_310);
  std::
  tuple<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~tuple(&local_378);
  GameBoard::GameBoard((GameBoard *)local_400,(GameBoard *)&end_gamestatus);
  DataSuppliment<Game::GameBoard,std::__cxx11::string(*)(Game::GameBoard)>
            (&local_3c0,(GameBoard *)local_400,Gameboard::Graphics::GameBoardTextOutput_abi_cxx11_);
  DrawAlways<DataSuppliment<Game::GameBoard,std::__cxx11::string(*)(Game::GameBoard)>(Game::GameBoard,std::__cxx11::string(*)(Game::GameBoard))::_lambda()_1_>
            ((ostream *)local_1e8,&local_3c0);
  DataSuppliment<Game::GameBoard,std::__cxx11::string(*)(Game::GameBoard)>(Game::GameBoard,std::__cxx11::string(*)(Game::GameBoard))
  ::{lambda()#1}::~DataSuppliment((_lambda___1_ *)&local_3c0);
  GameBoard::~GameBoard((GameBoard *)local_400);
  local_410 = world_gamestatus._M_elems;
  anon_unknown_1::make_end_screen_display_data((anon_unknown_1 *)&local_402,world_gamestatus);
  local_422 = local_402;
  DataSuppliment<std::tuple<bool,bool>,std::__cxx11::string(*)(std::tuple<bool,bool>)>
            (&local_420.needed_data,
             (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_tuple<bool,_bool>
              *)&local_422);
  DrawAlways<DataSuppliment<std::tuple<bool,bool>,std::__cxx11::string(*)(std::tuple<bool,bool>)>(std::tuple<bool,bool>,std::__cxx11::string(*)(std::tuple<bool,bool>))::_lambda()_1_>
            ((ostream *)local_1e8,&local_420);
  std::__cxx11::ostringstream::str();
  std::
  tuple<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~tuple((tuple<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)local_260);
  std::__cxx11::ostringstream::~ostringstream(local_1e8);
  GameBoard::~GameBoard((GameBoard *)&end_gamestatus);
  return this;
}

Assistant:

std::string drawEndGameLoopGraphics(current_game_session_t finalgamestatus) {
  // Graphical Output has a specific ordering...
  using namespace Graphics;
  using namespace Gameboard::Graphics;
  using tup_idx = tuple_cgs_t_idx;
  const auto bestScore = std::get<tup_idx::IDX_BESTSCORE>(finalgamestatus);
  const auto comp_mode = std::get<tup_idx::IDX_COMP_MODE>(finalgamestatus);
  const auto gb = std::get<tup_idx::IDX_GAMEBOARD>(finalgamestatus);
  const auto end_gamestatus =
      std::get<tup_idx::IDX_GAMESTATUS>(finalgamestatus);

  std::ostringstream str_os;

  // 1. Clear screen
  clearScreen();

  // 2. Draw Game Title Art
  DrawAlways(str_os, AsciiArt2048);

  // 3. Draw Scoreboard of ending current game session
  const auto scdd = make_scoreboard_display_data(bestScore, comp_mode, gb);
  DrawAlways(str_os, DataSuppliment(scdd, GameScoreBoardOverlay));

  // 4. Draw snapshot of ending 2048 session's gameboard
  DrawAlways(str_os, DataSuppliment(gb, GameBoardTextOutput));

  // 5. Draw "You win!" or "You Lose" prompt, only if not in endless mode.
  const auto esdd = make_end_screen_display_data(end_gamestatus);
  DrawAlways(str_os, DataSuppliment(esdd, GameEndScreenOverlay));

  return str_os.str();
}